

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls_Test::
~TEST_MockExpectedCall_multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls_Test
          (TEST_MockExpectedCall_multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls_Test
           *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls)
{
    MockCheckedExpectedCall expectedCall(3);
    expectedCall.withName("name");
    expectedCall.callWasMade(1);
    expectedCall.callWasMade(2);
    expectedCall.callWasMade(3);
    CHECK(expectedCall.isFulfilled());
    CHECK(!expectedCall.canMatchActualCalls());
}